

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O2

void run_ops(uint64_t ops,rng_t *rng,uint64_t *lat,void *get_buffer)

{
  size_t __size;
  size_t __n;
  FILE *__stream;
  void *pvVar1;
  rng_t *state;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  int *piVar7;
  undefined8 uVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  ulong uVar11;
  ulong *puVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined4 uVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint64_t local_a8;
  rng_t rng_1;
  uint64_t local_80;
  uint64_t local_78;
  undefined1 *local_70;
  uint64_t local_68;
  uint64_t opt;
  void *local_58;
  rng_t *local_50;
  double local_48;
  double dStack_40;
  ulong *local_38;
  
  local_78 = 0;
  puVar9 = &local_a8;
  opt = ops;
  local_58 = get_buffer;
  local_50 = rng;
  do {
    state = local_50;
    if (local_78 == opt) {
      return;
    }
    local_38 = lat;
    *(undefined8 *)((long)puVar9 + -8) = 0x1045cb;
    uVar3 = rnd64_r(state);
    *(undefined8 *)((long)puVar9 + -8) = 0x1045d9;
    uVar4 = n_lowest_bits(uVar3,(int)key_diversity);
    puVar10 = (uint64_t *)((long)puVar9 + -(key_size + 0x10 & 0xfffffffffffffff0));
    local_70 = (undefined1 *)puVar9;
    puVar10[-1] = 0x104603;
    randomize_r((rng_t *)&local_a8,uVar4);
    puVar9 = puVar10;
    for (uVar3 = key_size; 7 < uVar3; uVar3 = uVar3 - 8) {
      puVar10[-1] = 0x10461b;
      uVar5 = rnd64_r((rng_t *)&local_a8);
      *puVar9 = uVar5;
      puVar9 = puVar9 + 1;
    }
    if (uVar3 != 0) {
      puVar10[-1] = 0x104635;
      local_80 = rnd64_r((rng_t *)&local_a8);
      puVar10[-1] = 0x104648;
      memcpy(puVar9,&local_80,uVar3);
    }
    puVar12 = local_38;
    if (local_38 != (ulong *)0x0) {
      puVar10[-1] = 0x104656;
      local_68 = getticks();
    }
    pvVar1 = local_58;
    puVar10[-2] = 0;
    puVar10[-3] = 0x104684;
    lVar6 = vmemcache_get(cache,puVar10,key_size,pvVar1,get_size,0);
    uVar3 = min_size;
    uVar11 = 0;
    if (lVar6 < 0) {
      lVar6 = (max_size - min_size) + 1;
      auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = 0x45300000;
      local_48 = (double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0;
      dStack_40 = auVar14._8_8_ - 1.9342813113834067e+25;
      puVar10[-1] = 0x1046d2;
      uVar4 = hash64(vsize_seed ^ uVar4);
      if (size_distrib == 2) {
        puVar10[-1] = 1;
        dVar13 = (double)(long)((puVar10[-1] << (byte)(uVar4 >> 0x3b)) - 1 & uVar4 |
                               1L << (uVar4 >> 0x3b)) * 2.3283064365386963e-10;
      }
      else {
        uVar17 = (undefined4)(uVar4 >> 0x20);
        if (size_distrib == 1) {
          auVar16._8_4_ = uVar17;
          auVar16._0_8_ = uVar4;
          auVar16._12_4_ = 0x45300000;
          dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) *
                   5.421010862427522e-20;
          dVar13 = dVar13 * dVar13 * dVar13 * dVar13;
        }
        else {
          if (size_distrib != 0) {
            puVar10[-1] = 0x104911;
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                    ,0x157,"rndlength");
            puVar10[-1] = 0x1d;
            __size = puVar10[-1];
            puVar10[-1] = 1;
            __n = puVar10[-1];
            puVar10[-1] = 0x104926;
            fwrite("invalid enum for size distrib",__size,__n,_stderr);
            goto LAB_00104929;
          }
          auVar15._8_4_ = uVar17;
          auVar15._0_8_ = uVar4;
          auVar15._12_4_ = 0x45300000;
          dVar13 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) *
                   5.421010862427522e-20;
        }
      }
      dVar13 = (dStack_40 + local_48) * dVar13;
      uVar11 = (ulong)dVar13;
      uVar11 = uVar3 + ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
      if ((uVar11 < min_size) || (max_size < uVar11)) {
        puVar10[-1] = 0x104867;
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                ,0x176,"run_ops");
        puVar10[-1] = 0x104889;
        fprintf(_stderr,"ASSERT FAILED : size = %llu not in [%llu,%llu]",uVar11,min_size,max_size);
LAB_00104929:
        puVar10[-1] = 10;
        uVar8 = puVar10[-1];
        puVar10[-1] = 0x104931;
        fputc((int)uVar8,_stderr);
        puVar10[-1] = (uint64_t)getticks;
        abort();
      }
      puVar10[-1] = 0x1047e0;
      iVar2 = vmemcache_put(cache,puVar10,key_size,lotta_zeroes,uVar11);
      puVar12 = local_38;
      uVar11 = 0x8000000000000000;
      if (iVar2 != 0) {
        puVar10[-1] = 0x1047f7;
        piVar7 = __errno_location();
        if (*piVar7 != 0x11) {
          puVar10[-1] = 0x10489a;
          print_stats(cache);
          puVar10[-1] = 0x1048c5;
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0x17c,"run_ops");
          __stream = _stderr;
          puVar10[-1] = 0x1048cd;
          uVar8 = vmemcache_errormsg();
          puVar10[-1] = 0x1048e1;
          fprintf(__stream,"vmemcache_put failed: %s",uVar8);
          goto LAB_00104929;
        }
      }
    }
    if (puVar12 == (ulong *)0x0) {
      lat = (ulong *)0x0;
    }
    else {
      puVar10[-1] = 0x10480a;
      uVar3 = getticks();
      *puVar12 = uVar3 - local_68 | uVar11;
      lat = puVar12 + 1;
    }
    local_78 = local_78 + 1;
    puVar9 = (uint64_t *)local_70;
  } while( true );
}

Assistant:

static void
run_ops(uint64_t ops, rng_t *rng, uint64_t *lat, void *get_buffer)
{
	uint64_t opt, opt_tag;

	for (uint64_t count = 0; count < ops; count++) {
		uint64_t obj = n_lowest_bits(rnd64_r(rng), (int)key_diversity);

		char key[key_size + 1];
		fill_key(key, obj);

		if (lat)
			opt = getticks();

		if (vmemcache_get(cache, key, key_size, get_buffer, get_size, 0,
			NULL) < 0) {

			uint64_t size = min_size
				+ (uint64_t)((double)(max_size - min_size + 1)
				* rndlength(hash64(obj ^ vsize_seed)));
			UT_ASSERTin(size, min_size, max_size);

			if (vmemcache_put(cache, key, key_size, lotta_zeroes,
				size) && errno != EEXIST) {
				print_stats(cache);
				UT_FATAL("vmemcache_put failed: %s",
						vmemcache_errormsg());
			}

			opt_tag = PUT_TAG;
		} else {
			opt_tag = 0;
		}

		if (lat)
			*lat++ = (getticks() - opt) | opt_tag;
	}
}